

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenelinearindex_p.h
# Opt level: O3

void __thiscall
QGraphicsSceneLinearIndex::removeItem(QGraphicsSceneLinearIndex *this,QGraphicsItem *item)

{
  QGraphicsSceneLinearIndex *this_00;
  QGraphicsItem **ppQVar1;
  int iVar2;
  long lVar3;
  const_iterator abegin;
  iterator iVar4;
  ulong uVar5;
  iterator iVar6;
  iterator iVar7;
  ulong uVar8;
  
  this_00 = this + 0x10;
  if ((long)*(int *)(this + 0x28) < *(long *)(this + 0x20)) {
    iVar4 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)this_00);
    ppQVar1 = iVar4.i + *(int *)(this + 0x28);
    iVar4 = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)this_00);
    if (ppQVar1 != iVar4.i) {
      uVar5 = (long)iVar4.i - (long)ppQVar1 >> 3;
      lVar3 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<QList<QGraphicsItem*>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
                (ppQVar1,iVar4.i,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<QList<QGraphicsItem*>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
                (ppQVar1,iVar4.i);
    }
    iVar4 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)this_00);
    iVar6 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)this_00);
    iVar2 = *(int *)(this + 0x28);
    iVar7 = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)this_00);
    std::__inplace_merge<QList<QGraphicsItem*>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar4.i,iVar6.i + iVar2,iVar7.i);
    *(undefined4 *)(this + 0x28) = *(undefined4 *)(this + 0x20);
  }
  iVar4 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)this_00);
  iVar6 = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)this_00);
  uVar5 = (long)iVar6.i - (long)iVar4.i >> 3;
  while (abegin.i = iVar4.i, 0 < (long)uVar5) {
    uVar8 = uVar5 >> 1;
    uVar5 = ~uVar8 + uVar5;
    iVar4.i = abegin.i + uVar8 + 1;
    if (item <= abegin.i[uVar8]) {
      uVar5 = uVar8;
      iVar4.i = abegin.i;
    }
  }
  iVar4 = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)this_00);
  if ((abegin.i != iVar4.i) && (*abegin.i == item)) {
    QList<QGraphicsItem_*>::erase
              ((QList<QGraphicsItem_*> *)this_00,abegin,(const_iterator)(abegin.i + 1));
    *(int *)(this + 0x28) = *(int *)(this + 0x28) + -1;
  }
  return;
}

Assistant:

virtual void removeItem(QGraphicsItem *item) override
    {
        // Sort m_items if needed
        if (m_numSortedElements < m_items.size())
        {
            std::sort(m_items.begin() + m_numSortedElements, m_items.end() );
            std::inplace_merge(m_items.begin(), m_items.begin() + m_numSortedElements, m_items.end());
            m_numSortedElements = m_items.size();
        }

        QList<QGraphicsItem*>::iterator element = std::lower_bound(m_items.begin(), m_items.end(), item);
        if (element != m_items.end() && *element == item)
        {
            m_items.erase(element);
            --m_numSortedElements;
        }
    }